

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatred.cpp
# Opt level: O0

longdouble * __thiscall
TPZMatRed<long_double,_TPZFMatrix<long_double>_>::s
          (TPZMatRed<long_double,_TPZFMatrix<long_double>_> *this,int64_t r,int64_t c)

{
  int iVar1;
  TPZMatrix<long_double> *pTVar2;
  undefined4 extraout_var;
  TPZFMatrix<long_double> *in_RDX;
  long in_RSI;
  long *in_RDI;
  int64_t col;
  int64_t row;
  long local_28 [4];
  longdouble *local_8;
  
  local_28[0] = in_RSI;
  if (in_RSI < in_RDI[0x60]) {
    iVar1 = (**(code **)(*in_RDI + 0x80))();
    if ((iVar1 != 0) && ((long)in_RDX < local_28[0])) {
      Swap(local_28,(int64_t *)&stack0xffffffffffffffd0);
    }
  }
  if ((local_28[0] < in_RDI[0x60]) && ((long)in_RDX < in_RDI[0x60])) {
    pTVar2 = TPZAutoPointer<TPZMatrix<long_double>_>::operator->
                       ((TPZAutoPointer<TPZMatrix<long_double>_> *)(in_RDI + 4));
    iVar1 = (*(pTVar2->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                      (pTVar2,local_28[0],in_RDX);
    local_8 = (longdouble *)CONCAT44(extraout_var,iVar1);
  }
  else if ((local_28[0] < in_RDI[0x60]) && (in_RDI[0x60] <= (long)in_RDX)) {
    local_8 = TPZFMatrix<long_double>::s(in_RDX,(int64_t)in_RDI,0x1452dc4);
  }
  else if ((local_28[0] < in_RDI[0x60]) || (in_RDI[0x60] <= (long)in_RDX)) {
    local_8 = TPZFMatrix<long_double>::s(in_RDX,(int64_t)in_RDI,0x1452e42);
  }
  else {
    local_8 = TPZFMatrix<long_double>::s(in_RDX,(int64_t)in_RDI,0x1452e13);
  }
  return local_8;
}

Assistant:

TVar& TPZMatRed<TVar,TSideMatrix>::s(const int64_t r,const int64_t c ) {
	int64_t row(r),col(c);
	
	if (r < fDim0 && IsSymmetric() && row > col ) Swap( &row, &col );
	if (row<fDim0 &&  col<fDim0)  return ( fK00->s(row,col) );
	if (row<fDim0 &&  col>=fDim0)  return ( (TVar &)fK01.s(row,col-fDim0) );
	if (row>=fDim0 &&  col<fDim0)  return ( (TVar &)(fK10.s(row-fDim0,col)) );
	return ((TVar &)(fK11.s(row-fDim0,col-fDim0)) );
	
}